

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiColumns *pIVar1;
  int i;
  ImVector<ImGuiColumns> *this;
  ImGuiColumns IStack_a8;
  
  this = &window->ColumnsStorage;
  i = 0;
  while( true ) {
    if (this->Size <= i) {
      ImGuiColumns::ImGuiColumns(&IStack_a8);
      ImVector<ImGuiColumns>::push_back(this,&IStack_a8);
      ImGuiColumns::~ImGuiColumns(&IStack_a8);
      pIVar1 = ImVector<ImGuiColumns>::back(this);
      pIVar1->ID = id;
      return pIVar1;
    }
    pIVar1 = ImVector<ImGuiColumns>::operator[](this,i);
    if (pIVar1->ID == id) break;
    i = i + 1;
  }
  pIVar1 = ImVector<ImGuiColumns>::operator[](this,i);
  return pIVar1;
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}